

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O2

uc_err uc_hook_add(uc_engine *uc,uc_hook *hh,int type,void *callback,void *user_data,uint64_t begin,
                  uint64_t end,...)

{
  list *l;
  byte bVar1;
  _Bool _Var2;
  uint uVar3;
  uc_err uVar4;
  hook *h;
  GHashTable *pGVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  int in_stack_00000010;
  int in_stack_00000018;
  va_list valist;
  
  if ((uc->init_done == false) && (uVar4 = uc_init_engine(uc), uVar4 != UC_ERR_OK)) {
    return uVar4;
  }
  h = (hook *)calloc(1,0x40);
  if (h == (hook *)0x0) {
    return UC_ERR_NOMEM;
  }
  h->begin = begin;
  h->end = end;
  h->type = type;
  h->callback = callback;
  h->user_data = user_data;
  h->refs = 0;
  h->to_delete = false;
  pGVar5 = g_hash_table_new_full
                     (hooked_regions_hash,hooked_regions_equal,g_free,(GDestroyNotify)0x0);
  h->hooked_regions = pGVar5;
  *hh = (uc_hook)h;
  if ((type & 2U) == 0) {
    if (((uint)type >> 0x10 & 1) == 0) {
      lVar8 = 0;
      uVar7 = 0;
      while( true ) {
        bVar1 = (byte)uVar7 & 0x1f;
        uVar3 = type >> bVar1;
        if ((int)uVar3 < 1) break;
        if (uVar7 < 0x12 && (uVar3 & 1) != 0) {
          l = (list *)((long)&uc->hook[0].head + lVar8);
          if (uc->hook_insert == true) {
            pvVar6 = hook_insert(l,h);
          }
          else {
            pvVar6 = hook_append(l,h);
          }
          if (pvVar6 == (void *)0x0) goto LAB_00495a45;
          uc->hooks_count[uVar7] = uc->hooks_count[uVar7] + 1;
        }
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x18;
      }
      if (h->refs != 0) {
        return 0 >> bVar1;
      }
      free(h);
    }
    else {
      h->op = in_stack_00000010;
      h->op_flags = in_stack_00000018;
      if ((uc->opcode_hook_invalidate != (uc_opcode_hook_validate_t)0x0) &&
         (_Var2 = (*uc->opcode_hook_invalidate)(h->op,h->op_flags), !_Var2)) goto LAB_00495a21;
      if (uc->hook_insert == true) {
        pvVar6 = hook_insert(uc->hook + 0x10,h);
      }
      else {
        pvVar6 = hook_append(uc->hook + 0x10,h);
      }
      if (pvVar6 == (void *)0x0) goto LAB_00495a45;
      uc->hooks_count[0x10] = uc->hooks_count[0x10] + 1;
    }
  }
  else {
    h->insn = in_stack_00000010;
    if ((uc->insn_hook_validate != (uc_insn_hook_validate)0x0) &&
       (_Var2 = (*uc->insn_hook_validate)(h->insn), !_Var2)) {
LAB_00495a21:
      free(h);
      return UC_ERR_HOOK;
    }
    if (uc->hook_insert == true) {
      pvVar6 = hook_insert(uc->hook + 1,h);
    }
    else {
      pvVar6 = hook_append(uc->hook + 1,h);
    }
    if (pvVar6 == (void *)0x0) {
LAB_00495a45:
      free(h);
      return UC_ERR_NOMEM;
    }
    uc->hooks_count[1] = uc->hooks_count[1] + 1;
  }
  return UC_ERR_OK;
}

Assistant:

UNICORN_EXPORT
uc_err uc_hook_add(uc_engine *uc, uc_hook *hh, int type, void *callback,
                   void *user_data, uint64_t begin, uint64_t end, ...)
{
    int ret = UC_ERR_OK;
    int i = 0;

    UC_INIT(uc);

    struct hook *hook = calloc(1, sizeof(struct hook));
    if (hook == NULL) {
        return UC_ERR_NOMEM;
    }

    hook->begin = begin;
    hook->end = end;
    hook->type = type;
    hook->callback = callback;
    hook->user_data = user_data;
    hook->refs = 0;
    hook->to_delete = false;
    hook->hooked_regions = g_hash_table_new_full(
        hooked_regions_hash, hooked_regions_equal, g_free, NULL);
    *hh = (uc_hook)hook;

    // UC_HOOK_INSN has an extra argument for instruction ID
    if (type & UC_HOOK_INSN) {
        va_list valist;

        va_start(valist, end);
        hook->insn = va_arg(valist, int);
        va_end(valist);

        if (uc->insn_hook_validate) {
            if (!uc->insn_hook_validate(hook->insn)) {
                free(hook);
                return UC_ERR_HOOK;
            }
        }

        if (uc->hook_insert) {
            if (hook_insert(&uc->hook[UC_HOOK_INSN_IDX], hook) == NULL) {
                free(hook);
                return UC_ERR_NOMEM;
            }
        } else {
            if (hook_append(&uc->hook[UC_HOOK_INSN_IDX], hook) == NULL) {
                free(hook);
                return UC_ERR_NOMEM;
            }
        }

        uc->hooks_count[UC_HOOK_INSN_IDX]++;
        return UC_ERR_OK;
    }

    if (type & UC_HOOK_TCG_OPCODE) {
        va_list valist;

        va_start(valist, end);
        hook->op = va_arg(valist, int);
        hook->op_flags = va_arg(valist, int);
        va_end(valist);

        if (uc->opcode_hook_invalidate) {
            if (!uc->opcode_hook_invalidate(hook->op, hook->op_flags)) {
                free(hook);
                return UC_ERR_HOOK;
            }
        }

        if (uc->hook_insert) {
            if (hook_insert(&uc->hook[UC_HOOK_TCG_OPCODE_IDX], hook) == NULL) {
                free(hook);
                return UC_ERR_NOMEM;
            }
        } else {
            if (hook_append(&uc->hook[UC_HOOK_TCG_OPCODE_IDX], hook) == NULL) {
                free(hook);
                return UC_ERR_NOMEM;
            }
        }

        uc->hooks_count[UC_HOOK_TCG_OPCODE_IDX]++;
        return UC_ERR_OK;
    }

    while ((type >> i) > 0) {
        if ((type >> i) & 1) {
            // TODO: invalid hook error?
            if (i < UC_HOOK_MAX) {
                if (uc->hook_insert) {
                    if (hook_insert(&uc->hook[i], hook) == NULL) {
                        free(hook);
                        return UC_ERR_NOMEM;
                    }
                } else {
                    if (hook_append(&uc->hook[i], hook) == NULL) {
                        free(hook);
                        return UC_ERR_NOMEM;
                    }
                }
                uc->hooks_count[i]++;
            }
        }
        i++;
    }

    // we didn't use the hook
    // TODO: return an error?
    if (hook->refs == 0) {
        free(hook);
    }

    return ret;
}